

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<long,_8>::TPZManVector(TPZManVector<long,_8> *this,int64_t size,long *copy)

{
  long lVar1;
  undefined1 auVar2 [16];
  long *plVar3;
  long lVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  TPZVec<long>::TPZVec(&this->super_TPZVec<long>,0);
  (this->super_TPZVec<long>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018b7200;
  if (size < 9) {
    plVar3 = this->fExtAlloc;
    (this->super_TPZVec<long>).fStore = plVar3;
    (this->super_TPZVec<long>).fNElements = size;
    (this->super_TPZVec<long>).fNAlloc = 0;
    if (size < 1) {
      return;
    }
  }
  else {
    plVar3 = (long *)operator_new__(-(ulong)((ulong)size >> 0x3d != 0) | size * 8);
    (this->super_TPZVec<long>).fStore = plVar3;
    (this->super_TPZVec<long>).fNElements = size;
    (this->super_TPZVec<long>).fNAlloc = size;
  }
  auVar2 = _DAT_014d28c0;
  lVar1 = *copy;
  lVar4 = size + -1;
  auVar6._8_4_ = (int)lVar4;
  auVar6._0_8_ = lVar4;
  auVar6._12_4_ = (int)((ulong)lVar4 >> 0x20);
  uVar5 = 0;
  auVar6 = auVar6 ^ _DAT_014d28c0;
  auVar7 = _DAT_014d28b0;
  do {
    auVar8 = auVar7 ^ auVar2;
    if ((bool)(~(auVar8._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar8._0_4_ ||
                auVar6._4_4_ < auVar8._4_4_) & 1)) {
      plVar3[uVar5] = lVar1;
    }
    if ((auVar8._12_4_ != auVar6._12_4_ || auVar8._8_4_ <= auVar6._8_4_) &&
        auVar8._12_4_ <= auVar6._12_4_) {
      plVar3[uVar5 + 1] = lVar1;
    }
    uVar5 = uVar5 + 2;
    lVar4 = auVar7._8_8_;
    auVar7._0_8_ = auVar7._0_8_ + 2;
    auVar7._8_8_ = lVar4 + 2;
  } while ((size + 1U & 0xfffffffffffffffe) != uVar5);
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::TPZManVector(const int64_t size, const T& copy) :
TPZVec<T>(0)
//fNExtAlloc( NumExtAlloc ) // There is always some static allocation.
{
    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy;
    }
}